

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::TextureAttachmentErrorsTest::PrepareObjects
          (TextureAttachmentErrorsTest *this)

{
  code *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  int local_24;
  GLint i;
  bool is_attachment;
  long lStack_18;
  GLint max_color_attachments;
  Functions *gl;
  TextureAttachmentErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar4);
  (**(code **)(lStack_18 + 0x6d0))(1,&this->m_fbo_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenFramebuffers has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x143c);
  (**(code **)(lStack_18 + 0x78))(0x8d40,this->m_fbo_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x143f);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_to_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1442);
  (**(code **)(lStack_18 + 0xb8))(0xde1,this->m_to_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1445);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_tbo_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1448);
  (**(code **)(lStack_18 + 0xb8))(0x8c2a,this->m_tbo_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x144b);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_to_3d_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x144e);
  (**(code **)(lStack_18 + 0xb8))(0x806f,this->m_to_3d_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1451);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_to_array_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1454);
  (**(code **)(lStack_18 + 0xb8))(0x8c1a,this->m_to_array_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1457);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_to_cubearray_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x145a);
  (**(code **)(lStack_18 + 0xb8))(0x9009,this->m_to_cubearray_valid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x145d);
  (**(code **)(lStack_18 + 0x6f8))(1,&this->m_to_layer_invalid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGenTextures has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1460);
  (**(code **)(lStack_18 + 0xb8))(0x84f5,this->m_to_layer_invalid);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glBindFramebuffer has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1463);
  do {
    pcVar1 = *(code **)(lStack_18 + 0xc88);
    this->m_fbo_invalid = this->m_fbo_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  do {
    pcVar1 = *(code **)(lStack_18 + 0xcc8);
    this->m_to_invalid = this->m_to_invalid + 1;
    cVar2 = (*pcVar1)();
  } while (cVar2 != '\0');
  i = 8;
  (**(code **)(lStack_18 + 0x868))(0x8cdf,&i);
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x146e);
  this->m_color_attachment_invalid = i + 0x8ce0;
  bVar3 = true;
  while (bVar3) {
    this->m_attachment_invalid = this->m_attachment_invalid + 1;
    bVar3 = false;
    if (((this->m_attachment_invalid == 0x8d00) || (this->m_attachment_invalid == 0x8d20)) ||
       (this->m_attachment_invalid == 0x821a)) {
      bVar3 = true;
    }
    for (local_24 = 0; local_24 < i; local_24 = local_24 + 1) {
      if (this->m_attachment_invalid == 0x8ce0) {
        bVar3 = true;
      }
    }
  }
  (**(code **)(lStack_18 + 0x868))(0x8073,&this->m_max_3d_texture_size);
  (**(code **)(lStack_18 + 0x868))(0x88ff,&this->m_max_array_texture_layers);
  (**(code **)(lStack_18 + 0x868))(0x851c,&this->m_max_cube_map_texture_size);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar3 = glu::ContextInfo::isExtensionSupported(this_00,"GL_NV_deep_texture3D");
  if (bVar3) {
    (**(code **)(lStack_18 + 0x868))(0x90d1,&this->m_max_3d_texture_depth);
  }
  else {
    this->m_max_3d_texture_depth = this->m_max_3d_texture_size;
  }
  dVar5 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar5,"glGetIntegerv has failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                  ,0x1499);
  this->m_level_invalid = -1;
  return;
}

Assistant:

void TextureAttachmentErrorsTest::PrepareObjects()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Valid objects. */
	gl.genFramebuffers(1, &m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

	gl.bindFramebuffer(GL_FRAMEBUFFER, m_fbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D, m_to_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.genTextures(1, &m_tbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_BUFFER, m_tbo_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_3d_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_3D, m_to_3d_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_array_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_2D_ARRAY, m_to_array_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_cubearray_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, m_to_cubearray_valid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	gl.genTextures(1, &m_to_layer_invalid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures has failed");

	gl.bindTexture(GL_TEXTURE_RECTANGLE, m_to_layer_invalid);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer has failed");

	/* Invalid objects. */
	while (gl.isFramebuffer(++m_fbo_invalid))
		;
	while (gl.isTexture(++m_to_invalid))
		;

	/* Max color attachments query. */
	glw::GLint max_color_attachments = 8; /* Spec default. */
	gl.getIntegerv(GL_MAX_COLOR_ATTACHMENTS, &max_color_attachments);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	/* Invalid color attachment */
	m_color_attachment_invalid = GL_COLOR_ATTACHMENT0 + max_color_attachments;

	/* Invalid attachment. */
	bool is_attachment = true;

	while (is_attachment)
	{
		++m_attachment_invalid;

		is_attachment = false;

		if ((GL_DEPTH_ATTACHMENT == m_attachment_invalid) || (GL_STENCIL_ATTACHMENT == m_attachment_invalid) ||
			(GL_DEPTH_STENCIL_ATTACHMENT == m_attachment_invalid))
		{
			is_attachment = true;
		}

		for (glw::GLint i = 0; i < max_color_attachments; ++i)
		{
			if (GL_COLOR_ATTACHMENT0 == m_attachment_invalid)
			{
				is_attachment = true;
			}
		}
	}

	/* Maximum values */
	gl.getIntegerv(GL_MAX_3D_TEXTURE_SIZE, &m_max_3d_texture_size);
	gl.getIntegerv(GL_MAX_ARRAY_TEXTURE_LAYERS, &m_max_array_texture_layers);
	gl.getIntegerv(GL_MAX_CUBE_MAP_TEXTURE_SIZE, &m_max_cube_map_texture_size);

	if (m_context.getContextInfo().isExtensionSupported("GL_NV_deep_texture3D"))
	{
		gl.getIntegerv(GL_MAX_DEEP_3D_TEXTURE_DEPTH_NV, &m_max_3d_texture_depth);
	}
	else
	{
		m_max_3d_texture_depth = m_max_3d_texture_size;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv has failed");

	/* Invalid level. */
	m_level_invalid = -1;
}